

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Stress::anon_unknown_0::RenderCase::init(RenderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  RenderContext *renderCtx;
  int iVar1;
  RenderTarget *pRVar2;
  NotSupportedError *pNVar3;
  long *plVar4;
  undefined4 extraout_var;
  ShaderProgram *this_01;
  TestError *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  GLint maxTexSize;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [3];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar2->m_width;
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (this->m_renderTargetType == RENDERTARGETTYPE_FBO) {
    local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff00000000;
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0xd33,&local_238);
    if ((int)local_238._M_dataplus._M_p < 0x100) {
      pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_260._0_8_ = &local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"GL_MAX_TEXTURE_SIZE must be at least ","");
      de::toString<int>((string *)local_218,&Stress::(anonymous_namespace)::TEST_CANVAS_SIZE);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)local_1b0);
      __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if ((this->m_renderTargetType == RENDERTARGETTYPE_SCREEN) &&
          ((iVar1 < 0x100 || (pRVar2->m_height < 0x100)))) {
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"Render target size must be at least ","");
    de::toString<int>(&local_1f0,&Stress::(anonymous_namespace)::TEST_CANVAS_SIZE);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                   &local_238,&local_1f0);
    plVar4 = (long *)std::__cxx11::string::append(local_218);
    local_260._0_8_ = *plVar4;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._0_8_ == paVar5) {
      local_250._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_250._8_8_ = plVar4[3];
      local_260._0_8_ = &local_250;
    }
    else {
      local_250._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_260._8_8_ = plVar4[1];
    *plVar4 = (long)paVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    de::toString<int>(&local_1d0,&Stress::(anonymous_namespace)::TEST_CANVAS_SIZE);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   &local_1d0);
    tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)local_1b0);
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Creating test shader.",0x15);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_238,this);
  local_260._0_8_ = (ulong)(uint)local_260._4_4_ << 0x20;
  local_260._8_8_ = local_250._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_260 + 8),local_238._M_dataplus._M_p,
             local_238._M_dataplus._M_p + local_238._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_260._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_260 + 8));
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(&local_1f0,this);
  local_218._0_4_ = 1;
  local_218._8_8_ = &local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_218 + 8),local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (ulong)(uint)local_218._0_4_ * 0x18),(value_type *)(local_218 + 8));
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_1b0);
  this->m_program = this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._8_8_ != &local_200) {
    operator_delete((void *)local_218._8_8_,local_200._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_260._8_8_ != local_250._M_local_buf + 8) {
    operator_delete((void *)local_260._8_8_,local_250._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    return (int)this->m_program;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"shader compile failed","");
  tcu::TestError::TestError(this_02,(string *)local_1b0);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RenderCase::init (void)
{
	const int width	 = m_context.getRenderTarget().getWidth();
	const int height = m_context.getRenderTarget().getHeight();

	// check target size
	if (m_renderTargetType == RENDERTARGETTYPE_SCREEN)
	{
		if (width < TEST_CANVAS_SIZE || height < TEST_CANVAS_SIZE)
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(TEST_CANVAS_SIZE) + "x" + de::toString(TEST_CANVAS_SIZE));
	}
	else if (m_renderTargetType == RENDERTARGETTYPE_FBO)
	{
		GLint maxTexSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);

		if (maxTexSize < TEST_CANVAS_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_CANVAS_SIZE));
	}
	else
		DE_ASSERT(false);

	// gen shader

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shader." << tcu::TestLog::EndMessage;

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(genVertexSource()) << glu::FragmentSource(genFragmentSource()));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("shader compile failed");
}